

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O0

Boxed_Value __thiscall
chaiscript::detail::Dispatch_Engine::call_exists(Dispatch_Engine *this,Function_Params *params)

{
  bool bVar1;
  int iVar2;
  arity_error *this_00;
  size_t sVar3;
  Conversion_Saves *t_saves;
  element_type *peVar4;
  Boxed_Value *pBVar5;
  Boxed_Value *t_end;
  Function_Params *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Boxed_Value BVar6;
  Function_Params local_68;
  undefined1 local_58 [8];
  Type_Conversions_State convs;
  shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base> *f;
  Function_Params *params_local;
  Dispatch_Engine *this_local;
  
  bVar1 = Function_Params::empty(in_RDX);
  if (!bVar1) {
    Function_Params::operator[](in_RDX,0);
    boxed_cast<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>>
              ((Dispatch_Engine *)&convs.m_saves,(Boxed_Value *)params);
    t_saves = Type_Conversions::conversion_saves((Type_Conversions *)&params[3].m_end);
    Type_Conversions_State::Type_Conversions_State
              ((Type_Conversions_State *)local_58,(Type_Conversions *)&params[3].m_end,t_saves);
    peVar4 = std::
             __shared_ptr_access<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&convs.m_saves);
    pBVar5 = Function_Params::begin(in_RDX);
    t_end = Function_Params::end(in_RDX);
    Function_Params::Function_Params(&local_68,pBVar5 + 1,t_end);
    iVar2 = (*peVar4->_vptr_Proxy_Function_Base[3])(peVar4,&local_68,local_58);
    const_var((chaiscript *)this,(bool)((byte)iVar2 & 1));
    std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
              ((shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base> *)&convs.m_saves);
    BVar6.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = extraout_RDX._M_pi;
    BVar6.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)this;
    return (Boxed_Value)
           BVar6.m_data.
           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (arity_error *)__cxa_allocate_exception(0x18);
  sVar3 = Function_Params::size(in_RDX);
  chaiscript::exception::arity_error::arity_error(this_00,(int)sVar3,1);
  __cxa_throw(this_00,&chaiscript::exception::arity_error::typeinfo,
              chaiscript::exception::arity_error::~arity_error);
}

Assistant:

Boxed_Value call_exists(const Function_Params &params) const {
        if (params.empty()) {
          throw chaiscript::exception::arity_error(static_cast<int>(params.size()), 1);
        }

        const auto &f = this->boxed_cast<Const_Proxy_Function>(params[0]);
        const Type_Conversions_State convs(m_conversions, m_conversions.conversion_saves());

        return const_var(f->call_match(Function_Params(params.begin() + 1, params.end()), convs));
      }